

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<char>::emplaceRealloc<char>
          (SmallVectorBase<char> *this,pointer pos,char *args)

{
  ulong uVar1;
  pointer __dest;
  EVP_PKEY_CTX *__n;
  EVP_PKEY_CTX *ctx;
  pointer __dest_00;
  ulong capacity;
  long lVar2;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar2 = (long)pos - (long)this->data_;
  __dest = (pointer)detail::allocArray(capacity,1);
  __dest[lVar2] = *args;
  ctx = (EVP_PKEY_CTX *)this->data_;
  __n = (EVP_PKEY_CTX *)this->len;
  if (ctx + (long)__n == (EVP_PKEY_CTX *)pos) {
    __dest_00 = __dest;
    if (__n == (EVP_PKEY_CTX *)0x0) goto LAB_00157755;
  }
  else {
    if (ctx != (EVP_PKEY_CTX *)pos) {
      memmove(__dest,ctx,(long)pos - (long)ctx);
      ctx = (EVP_PKEY_CTX *)this->data_;
      __n = (EVP_PKEY_CTX *)this->len;
    }
    __n = ctx + ((long)__n - (long)pos);
    if (__n == (EVP_PKEY_CTX *)0x0) goto LAB_00157755;
    ctx = (EVP_PKEY_CTX *)pos;
    __dest_00 = __dest + lVar2 + 1;
  }
  memmove(__dest_00,ctx,(size_t)__n);
LAB_00157755:
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __dest;
  return __dest + lVar2;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}